

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplaceValue<QRestAccessManagerPrivate::CallerInfo_const&>
          (Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *this,CallerInfo *args)

{
  long lVar1;
  CallerInfo *in_RDI;
  long in_FS_OFFSET;
  CallerInfo *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRestAccessManagerPrivate::CallerInfo::CallerInfo(in_RDI,in_stack_ffffffffffffffb8);
  QRestAccessManagerPrivate::CallerInfo::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QRestAccessManagerPrivate::CallerInfo::~CallerInfo(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }